

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void __thiscall CompilerContext::compile_switch(CompilerContext *this,SyntaxTree *switch_node)

{
  size_t sVar1;
  bool bVar2;
  NodeType NVar3;
  SwitchAnnotation *pSVar4;
  SyntaxTree *pSVar5;
  SyntaxTree *pSVar6;
  SwitchCaseAnnotation *__args_1;
  reference pvVar7;
  pointer pCVar8;
  Command *pCVar9;
  shared_ptr<Label> local_140;
  shared_ptr<Label> local_130;
  optional<const_Command_&> local_120;
  optional<const_Command_&> opt_switch_continued;
  optional<const_Command_&> opt_switch_start;
  __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
  local_100;
  iterator e;
  __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
  local_d0;
  __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
  local_c8;
  __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
  local_c0;
  iterator it;
  iterator blank_cases_end;
  iterator blank_cases_begin;
  value_type *prev_case;
  Command **isveq;
  SyntaxTree *pSStack_90;
  int value;
  SyntaxTree *node;
  size_t i;
  SyntaxTree *switch_body;
  vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> cases;
  LoopInfo local_50;
  shared_ptr<Label> break_ptr;
  void *continue_ptr;
  SyntaxTree *switch_node_local;
  CompilerContext *this_local;
  
  break_ptr.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  make_internal_label((CompilerContext *)&stack0xffffffffffffffd0);
  std::shared_ptr<Label>::shared_ptr(&local_50.continue_label,(nullptr_t)0x0);
  std::shared_ptr<Label>::shared_ptr
            (&local_50.break_label,(shared_ptr<Label> *)&stack0xffffffffffffffd0);
  std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>::
  emplace_back<CompilerContext::LoopInfo>(&this->loop_stack,&local_50);
  LoopInfo::~LoopInfo(&local_50);
  std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::vector
            ((vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)&switch_body);
  pSVar4 = SyntaxTree::annotation<SwitchAnnotation_const&>(switch_node);
  std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::reserve
            ((vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)&switch_body,
             pSVar4->num_cases + 1);
  i = (size_t)SyntaxTree::child(switch_node,1);
  for (node = (SyntaxTree *)0x0; pSVar6 = node,
      pSVar5 = (SyntaxTree *)SyntaxTree::child_count((SyntaxTree *)i), pSVar6 < pSVar5;
      node = (SyntaxTree *)
             ((long)&(node->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
                     super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1)) {
    pSStack_90 = SyntaxTree::child((SyntaxTree *)i,(size_t)node);
    NVar3 = SyntaxTree::type(pSStack_90);
    if (NVar3 == CASE) {
      pSVar6 = SyntaxTree::child(pSStack_90,0);
      isveq._4_4_ = SyntaxTree::annotation<int>(pSVar6);
      __args_1 = SyntaxTree::annotation<SwitchCaseAnnotation_const&>(pSStack_90);
      std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>::
      emplace_back<int&,Command_const*const&>
                ((vector<CompilerContext::Case,std::allocator<CompilerContext::Case>> *)&switch_body
                 ,(int *)((long)&isveq + 4),&__args_1->is_var_eq_int);
    }
    else if (NVar3 == DEFAULT) {
      std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>::
      emplace_back<std::experimental::nullopt_t_const&,std::experimental::nullopt_t_const&>
                ((vector<CompilerContext::Case,std::allocator<CompilerContext::Case>> *)&switch_body
                 ,(nullopt_t *)&nullopt,(nullopt_t *)&nullopt);
    }
    else {
      bVar2 = std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::empty
                        ((vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)
                         &switch_body);
      if (!bVar2) {
        pvVar7 = std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::back
                           ((vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *
                            )&switch_body);
        if (pvVar7->first_statement_id == 0xffffffffffffffff) {
          pvVar7->first_statement_id = (size_t)node;
        }
        pvVar7->last_statement_id = (size_t)node;
      }
    }
  }
  blank_cases_end =
       std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::end
                 ((vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)
                  &switch_body);
  it = std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::end
                 ((vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)
                  &switch_body);
  local_c0._M_current =
       (Case *)std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::begin
                         ((vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)
                          &switch_body);
  while( true ) {
    local_c8._M_current =
         (Case *)std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::end
                           ((vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *
                            )&switch_body);
    bVar2 = __gnu_cxx::operator!=(&local_c0,&local_c8);
    if (!bVar2) break;
    pCVar8 = __gnu_cxx::
             __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
             ::operator->(&local_c0);
    bVar2 = Case::is_empty(pCVar8);
    if (bVar2) {
      local_d0._M_current =
           (Case *)std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::end
                             ((vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>
                               *)&switch_body);
      bVar2 = __gnu_cxx::operator==(&blank_cases_end,&local_d0);
      if (bVar2) {
        blank_cases_end._M_current = local_c0._M_current;
        it._M_current =
             (Case *)std::
                     next<__gnu_cxx::__normal_iterator<CompilerContext::Case*,std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>>>
                               (local_c0,1);
      }
      else {
        it._M_current =
             (Case *)std::
                     next<__gnu_cxx::__normal_iterator<CompilerContext::Case*,std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>>>
                               (local_c0,1);
      }
    }
    else {
      e = std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::end
                    ((vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)
                     &switch_body);
      bVar2 = __gnu_cxx::operator!=(&blank_cases_end,&e);
      if (bVar2) {
        local_100._M_current = blank_cases_end._M_current;
        while (bVar2 = __gnu_cxx::operator!=(&local_100,&it), bVar2) {
          pCVar8 = __gnu_cxx::
                   __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
                   ::operator->(&local_c0);
          sVar1 = pCVar8->first_statement_id;
          pCVar8 = __gnu_cxx::
                   __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
                   ::operator->(&local_100);
          pCVar8->first_statement_id = sVar1;
          pCVar8 = __gnu_cxx::
                   __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
                   ::operator->(&local_c0);
          sVar1 = pCVar8->last_statement_id;
          pCVar8 = __gnu_cxx::
                   __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
                   ::operator->(&local_100);
          pCVar8->last_statement_id = sVar1;
          __gnu_cxx::
          __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
          ::operator++(&local_100);
        }
        blank_cases_end =
             std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::end
                       ((vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)
                        &switch_body);
        it = std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::end
                       ((vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)
                        &switch_body);
      }
    }
    __gnu_cxx::
    __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
    ::operator++(&local_c0);
  }
  std::experimental::optional<const_Command_&>::optional
            (&opt_switch_continued,&this->commands->switch_start);
  std::experimental::optional<const_Command_&>::optional
            (&local_120,&this->commands->switch_continued);
  bVar2 = std::experimental::optional::operator_cast_to_bool((optional *)&opt_switch_continued);
  if ((((bVar2) &&
       (pCVar9 = std::experimental::optional<const_Command_&>::operator->(&opt_switch_continued),
       (pCVar9->supported & 1U) != 0)) &&
      (bVar2 = std::experimental::optional::operator_cast_to_bool((optional *)&local_120), bVar2))
     && (pCVar9 = std::experimental::optional<const_Command_&>::operator->(&local_120),
        (pCVar9->supported & 1U) != 0)) {
    std::shared_ptr<Label>::shared_ptr(&local_130,(shared_ptr<Label> *)&stack0xffffffffffffffd0);
    compile_switch_withop
              (this,switch_node,
               (vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)&switch_body
               ,&local_130);
    std::shared_ptr<Label>::~shared_ptr(&local_130);
  }
  else {
    std::shared_ptr<Label>::shared_ptr(&local_140,(shared_ptr<Label> *)&stack0xffffffffffffffd0);
    compile_switch_ifchain
              (this,switch_node,
               (vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)&switch_body
               ,&local_140);
    std::shared_ptr<Label>::~shared_ptr(&local_140);
  }
  std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>::pop_back
            (&this->loop_stack);
  std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::~vector
            ((vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)&switch_body);
  std::shared_ptr<Label>::~shared_ptr((shared_ptr<Label> *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void CompilerContext::compile_switch(const SyntaxTree& switch_node)
{
    auto continue_ptr = nullptr;
    auto break_ptr = make_internal_label();

    loop_stack.emplace_back(LoopInfo{ continue_ptr, break_ptr });

    std::vector<Case> cases;
    cases.reserve(1 + switch_node.annotation<const SwitchAnnotation&>().num_cases);

    auto& switch_body = switch_node.child(1);
    for(size_t i = 0; i < switch_body.child_count(); ++i)
    {
        auto& node = switch_body.child(i);
        switch(node.type())
        {
            case NodeType::CASE:
            {
                auto value  = node.child(0).annotation<int32_t>();
                auto& isveq = node.annotation<const SwitchCaseAnnotation&>().is_var_eq_int;
                cases.emplace_back(value, isveq);
                break;
            }

            case NodeType::DEFAULT:
            {
                cases.emplace_back(nullopt, nullopt);
                break;
            }

            default: // statement
            {
                if(!cases.empty())
                {
                    auto& prev_case = cases.back();
                    if(prev_case.first_statement_id == SIZE_MAX)
                        prev_case.first_statement_id = i;
                    prev_case.last_statement_id = i;
                }
                break;
            }
        }
    }

    auto blank_cases_begin = cases.end();
    auto blank_cases_end   = cases.end();

    for(auto it = cases.begin(); it != cases.end(); ++it)
    {
        if(it->is_empty())
        {
            if(blank_cases_begin == cases.end())
            {
                blank_cases_begin = it;
                blank_cases_end   = std::next(it);
            }
            else
            {
                blank_cases_end = std::next(it);
            }
        }
        else
        {
            if(blank_cases_begin != cases.end())
            {
                for(auto e = blank_cases_begin; e != blank_cases_end; ++e)
                {
                    e->first_statement_id = it->first_statement_id;
                    e->last_statement_id  = it->last_statement_id;
                }

                blank_cases_begin = cases.end();
                blank_cases_end = cases.end();
            }
        }
    }

    auto opt_switch_start = commands.switch_start;
    auto opt_switch_continued = commands.switch_continued;

    if(opt_switch_start && opt_switch_start->supported
    && opt_switch_continued && opt_switch_continued->supported)
    {
        compile_switch_withop(switch_node, cases, break_ptr);
    }
    else
    {
        compile_switch_ifchain(switch_node, cases, break_ptr);
    }

    loop_stack.pop_back();
}